

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O1

uint32_t address_space_lduw_internal_cached_slow_ppc64
                   (uc_struct_conflict11 *uc,MemoryRegionCache *cache,hwaddr addr,MemTxAttrs attrs,
                   MemTxResult *result,device_endian endian)

{
  ushort uVar1;
  MemTxResult MVar2;
  ushort *puVar3;
  AddressSpace **target_as_00;
  IOMMUMemoryRegion *iommu_mr;
  hwaddr addr1;
  hwaddr l;
  AddressSpace *target_as;
  uint64_t val;
  ulong uVar4;
  undefined1 local_70 [8];
  MemoryRegionSection local_68;
  
  uVar4 = 2;
  if (cache->ptr == (void *)0x0) {
    target_as_00 = (AddressSpace **)(addr + cache->xlat);
    iommu_mr = (IOMMUMemoryRegion *)(cache->mrs).mr;
    if ((iommu_mr != (IOMMUMemoryRegion *)0x0) && ((iommu_mr->parent_obj).is_iommu != false)) {
      address_space_translate_iommu
                (&local_68,iommu_mr,(hwaddr *)&stack0xffffffffffffff80,
                 (hwaddr *)&stack0xffffffffffffff88,(hwaddr *)0x0,SUB81(local_70,0),attrs._0_1_,
                 target_as_00,(MemTxAttrs)0x2);
      iommu_mr = (IOMMUMemoryRegion *)local_68.mr;
    }
    if ((uVar4 < 2) || ((iommu_mr->parent_obj).ram == false)) {
      MVar2 = memory_region_dispatch_read_ppc64
                        (uc,&iommu_mr->parent_obj,(hwaddr)target_as_00,(uint64_t *)&local_68,
                         (uint)(endian != DEVICE_LITTLE_ENDIAN) * 8 + MO_16,attrs);
    }
    else {
      puVar3 = (ushort *)
               qemu_map_ram_ptr_ppc64
                         ((uc_struct_conflict11 *)(iommu_mr->parent_obj).uc,
                          (iommu_mr->parent_obj).ram_block,(ram_addr_t)target_as_00);
      uVar1 = *puVar3;
      if ((endian == DEVICE_BIG_ENDIAN) || (endian != DEVICE_LITTLE_ENDIAN)) {
        uVar1 = uVar1 << 8 | uVar1 >> 8;
      }
      local_68.size._0_4_ = (uint)uVar1;
      MVar2 = 0;
    }
    if (result != (MemTxResult *)0x0) {
      *result = MVar2;
    }
    return (uint)local_68.size;
  }
  __assert_fail("!cache->ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                ,0x7b1,
                "MemoryRegion *address_space_translate_cached(MemoryRegionCache *, hwaddr, hwaddr *, hwaddr *, _Bool, MemTxAttrs)"
               );
}

Assistant:

static inline uint32_t glue(address_space_lduw_internal, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, MemTxAttrs attrs, MemTxResult *result,
    enum device_endian endian)
{
    uint8_t *ptr;
    uint64_t val;
    MemoryRegion *mr;
    hwaddr l = 2;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, false, attrs);
    if (l < 2 || !memory_access_is_direct(mr, false)) {
        release_lock |= prepare_mmio_access(mr);

        /* I/O case */
        r = memory_region_dispatch_read(uc, mr, addr1, &val,
                                        MO_16 | devend_memop(endian), attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        switch (endian) {
        case DEVICE_LITTLE_ENDIAN:
            val = lduw_le_p(ptr);
            break;
        case DEVICE_BIG_ENDIAN:
            val = lduw_be_p(ptr);
            break;
        default:
            val = lduw_p(ptr);
            break;
        }
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
    return val;
}